

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O3

void __thiscall QMarkdownTextEdit::paintEvent(QMarkdownTextEdit *this,QPaintEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  int *piVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  QTextOption *pQVar13;
  qreal extraout_RDX;
  bool bVar14;
  QPaintDevice *pQVar15;
  undefined4 uVar16;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QColor QVar19;
  QPainter painter;
  QTextOption opt;
  QTextCursor cursor;
  QBrush brush;
  QTextBlock block;
  QRect local_160;
  double local_150;
  undefined1 local_148 [16];
  double local_138;
  double dStack_130;
  QTextCursor local_128 [8];
  QRectF local_120;
  int local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  undefined1 local_d8 [16];
  QPaintEvent *local_c0;
  double local_b8;
  double local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined2 local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  QColor local_68;
  double local_58;
  QTextDocumentPrivate *local_40 [2];
  
  local_c0 = e;
  QPlainTextEdit::firstVisibleBlock();
  lVar11 = QAbstractScrollArea::viewport();
  pQVar15 = (QPaintDevice *)(lVar11 + 0x10);
  if (lVar11 == 0) {
    pQVar15 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter((QPainter *)&local_160,pQVar15);
  lVar11 = QAbstractScrollArea::viewport();
  lVar11 = *(long *)(lVar11 + 0x20);
  iVar10 = *(int *)(lVar11 + 0x1c);
  iVar1 = *(int *)(lVar11 + 0x14);
  iVar2 = *(int *)(lVar11 + 0x18);
  iVar3 = *(int *)(lVar11 + 0x20);
  local_58 = (double)QPlainTextEdit::contentOffset();
  local_d8._8_8_ = in_XMM1_Qb;
  local_d8._0_8_ = in_XMM1_Qa;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_f8 = 0.0;
  dStack_f0 = 0.0;
  local_148._0_4_ = Hsl;
  QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
            (&MarkdownHighlighter::_formats,(HighlighterState *)local_148);
  QTextFormat::brushProperty((int)&local_120);
  cVar8 = QBrush::isOpaque();
  if (cVar8 == '\0') {
    QColor::QColor((QColor *)local_148,transparent);
  }
  else {
    local_148 = *(undefined1 (*) [16])(CONCAT44(local_120.xp._4_4_,local_120.xp._0_4_) + 8);
  }
  QBrush::~QBrush((QBrush *)&local_120);
  local_40[0] = (QTextDocumentPrivate *)local_148._0_8_;
  local_40[1]._0_4_ = local_148._8_4_;
  local_40[1]._4_2_ = local_148._12_2_;
  local_b0 = (double)((iVar3 - iVar2) + 1);
  local_b8 = (double)((iVar10 - iVar1) + 1);
  bVar14 = true;
  bVar5 = false;
  local_150 = 0.0;
  local_160.y2 = 0;
  bVar7 = false;
  do {
    bVar9 = QTextBlock::isValid();
    if (bVar5 || (~bVar9 & 1) != 0) {
      QPainter::end();
      QPlainTextEdit::paintEvent((QPaintEvent *)this);
      QPainter::~QPainter((QPainter *)&local_160);
      return;
    }
    QPlainTextEdit::blockBoundingRect((QTextBlock *)local_148);
    local_98._8_4_ = SUB84((double)local_d8._0_8_ + (double)local_148._8_8_,0);
    local_98._0_8_ = local_58 + (double)local_148._0_8_;
    local_98._12_4_ = (int)((ulong)((double)local_d8._0_8_ + (double)local_148._8_8_) >> 0x20);
    local_78 = local_138;
    dStack_70 = dStack_130;
    iVar10 = QTextBlock::userState();
    local_88._8_4_ = SUB84(dStack_70,0);
    local_88._0_8_ = dStack_70;
    local_88._12_4_ = (int)((ulong)dStack_70 >> 0x20);
    if (bVar7) {
      if ((iVar10 != 100) && (iVar10 != 0x61)) goto LAB_001171b0;
LAB_001171f7:
      bVar7 = false;
      dStack_e0 = local_150;
      bVar14 = true;
    }
    else {
      if (((iVar10 - 4U < 2) || (iVar10 - 0x62U < 2)) || (199 < iVar10)) {
        QTextBlock::text();
        QVar17.m_data = (char *)0x3;
        QVar17.m_size = (qsizetype)local_148;
        cVar8 = QString::startsWith(QVar17,0x14b953);
        if (cVar8 == '\0') {
          QTextBlock::text();
          QVar18.m_data = (char *)0x3;
          QVar18.m_size = (qsizetype)&local_120;
          bVar9 = QString::startsWith(QVar18,0x14b957);
          piVar6 = (int *)CONCAT44(local_120.xp._4_4_,local_120.xp._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_120.xp._4_4_,local_120.xp._0_4_),2,8);
            }
          }
          bVar9 = bVar9 ^ 1;
        }
        else {
          bVar9 = 0;
        }
        if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_148._0_8_,2,8);
          }
        }
        if (bVar9 != 0) {
          local_f8 = (double)local_98._0_8_;
          dStack_f0 = (double)local_98._8_8_;
          local_e8 = local_78;
          dStack_e0 = dStack_70;
          bVar7 = true;
          local_150 = 0.0;
        }
        QTextBlock::previous();
        uVar12 = QTextBlock::userState();
        if ((bVar14) &&
           (((iVar10 = (int)uVar12, iVar10 - 4U < 2 || (iVar10 - 0x62U < 2)) || (199 < iVar10)))) {
          local_160.y2 = (int)CONCAT71((int7)((ulong)uVar12 >> 8),1);
        }
      }
LAB_001171b0:
      if (bVar7) {
        QPlainTextEdit::document();
        QTextDocument::lastBlock();
        bVar14 = false;
        if ((local_120.h == (qreal)local_148._0_8_) &&
           (bVar14 = false, local_100 == local_148._8_4_)) {
          local_150 = local_150 + (double)local_88._0_8_;
          goto LAB_001171f7;
        }
      }
      else {
        bVar14 = false;
      }
    }
    uVar16 = local_d8._12_4_;
    dVar4 = local_d8._0_8_ + (double)local_88._0_8_;
    local_150 = local_150 + (double)local_88._0_8_;
    local_d8._8_4_ = local_d8._8_4_;
    local_d8._0_8_ = dVar4;
    local_d8._12_4_ = uVar16;
    bVar5 = local_b0 < dVar4;
    if (((local_b0 < dVar4) && (dVar4 = local_150, bVar7)) || (dVar4 = dStack_e0, bVar14)) {
      dStack_e0 = dVar4;
      QPainter::setCompositionMode((CompositionMode)&local_160);
      QPainter::setPen((PenStyle)&local_160);
      QBrush::QBrush((QBrush *)local_148,(QColor *)local_40,SolidPattern);
      QPainter::setBrush((QBrush *)&local_160);
      QBrush::~QBrush((QBrush *)local_148);
      if ((local_160.y2 & 1U) == 0) {
        local_160.y2 = 0;
        QPainter::drawRoundedRect(&local_160,&local_f8,0);
      }
      else {
        QPainterPath::QPainterPath((QPainterPath *)&local_120);
        QPainterPath::setFillRule((FillRule)&local_120);
        QPainterPath::addRoundedRect(0,0x4014000000000000,&local_120,&local_f8,0);
        local_138 = local_e8 + 0.0;
        dStack_130 = dStack_e0 * -0.5 + dStack_e0;
        local_148._8_4_ = SUB84(dStack_f0 + 0.0,0);
        local_148._0_8_ = local_f8 + 0.0;
        local_148._12_4_ = (int)((ulong)(dStack_f0 + 0.0) >> 0x20);
        QPainterPath::addRect(&local_120);
        QPainterPath::simplified();
        QPainter::drawPath((QPainterPath *)&local_160);
        QPainterPath::~QPainterPath((QPainterPath *)local_148);
        QPainterPath::~QPainterPath((QPainterPath *)&local_120);
        local_160.y2 = 0;
      }
    }
    QTextBlock::text();
    cVar8 = QString::isRightToLeft();
    if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148._0_8_,2,8);
      }
    }
    if (cVar8 != '\0') {
      pQVar13 = (QTextOption *)QTextBlock::layout();
      QTextOption::QTextOption((QTextOption *)local_148,2);
      local_148._0_4_ = local_148._0_4_ & 0xffff3fff | 0x4000;
      QTextLayout::setTextOption(pQVar13);
      QTextOption::~QTextOption((QTextOption *)local_148);
    }
    QPlainTextEdit::textCursor();
    if (this->_highlightCurrentLine == true) {
      QTextCursor::block();
      if (((qreal)local_148._0_8_ == local_120.h) && (local_148._8_4_ == local_100)) {
        iVar10 = QTextBlock::layout();
        QTextCursor::positionInBlock();
        local_120.xp._0_4_ = QTextLayout::lineForTextPosition(iVar10);
        local_120.yp = extraout_RDX;
        QTextLine::rect();
        local_148._0_8_ = (0.0 - (double)local_148._0_8_) + (double)local_148._0_8_;
        local_148._8_8_ = (double)local_98._8_8_ + (double)local_148._8_8_;
        local_138 = local_b8 - (double)local_148._0_8_;
        QVar19 = (QColor)QRectF::toAlignedRect();
        local_a8 = *(undefined8 *)&this->_currentLineHighlightColor;
        uVar12 = *(undefined8 *)((long)&(this->_currentLineHighlightColor).ct + 4);
        local_a0 = (undefined4)uVar12;
        local_9c = (undefined2)((ulong)uVar12 >> 0x20);
        local_68 = QVar19;
        QPainter::fillRect(&local_160,&local_68);
      }
    }
    QTextBlock::next();
    local_120.h = (qreal)local_148._0_8_;
    local_100 = local_148._8_4_;
    QTextCursor::~QTextCursor(local_128);
    bVar14 = false;
  } while( true );
}

Assistant:

void QMarkdownTextEdit::paintEvent(QPaintEvent *e) {
    QTextBlock block = firstVisibleBlock();

    QPainter painter(viewport());
    const QRect viewportRect = viewport()->rect();
    // painter.fillRect(viewportRect, Qt::transparent);
    bool firstVisible = true;
    QPointF offset(contentOffset());
    QRectF blockAreaRect;    // Code or block quote rect.
    bool inBlockArea = false;

    bool clipTop = false;
    bool drawBlock = false;
    qreal dy = 0.0;
    bool done = false;

    const QColor &color = MarkdownHighlighter::codeBlockBackgroundColor();
    const int cornerRadius = 5;

    while (block.isValid() && !done) {
        const QRectF r = blockBoundingRect(block).translated(offset);
        const int state = block.userState();

        if (!inBlockArea && MarkdownHighlighter::isCodeBlock(state)) {
            // skip the backticks
            if (!block.text().startsWith(QLatin1String("```")) &&
                !block.text().startsWith(QLatin1String("~~~"))) {
                blockAreaRect = r;
                dy = 0.0;
                inBlockArea = true;
            }

            // If this is the first visible block within the viewport
            // and if the previous block is part of the text block area,
            // then the rectangle to draw for the block area will have
            // its top clipped by the viewport and will need to be
            // drawn specially.
            const int prevBlockState = block.previous().userState();
            if (firstVisible &&
                MarkdownHighlighter::isCodeBlock(prevBlockState)) {
                clipTop = true;
            }
        }
        // Else if the block ends a text block area...
        else if (inBlockArea && MarkdownHighlighter::isCodeBlockEnd(state)) {
            drawBlock = true;
            inBlockArea = false;
            blockAreaRect.setHeight(dy);
        }
        // If the block is at the end of the document and ends a text
        // block area...
        //
        if (inBlockArea && block == this->document()->lastBlock()) {
            drawBlock = true;
            inBlockArea = false;
            dy += r.height();
            blockAreaRect.setHeight(dy);
        }
        offset.ry() += r.height();
        dy += r.height();

        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }

            // Finished drawing.
            done = true;
        }
        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }
            // Finished drawing.
            done = true;
        }

        if (drawBlock) {
            painter.setCompositionMode(QPainter::CompositionMode_SourceOver);
            painter.setPen(Qt::NoPen);
            painter.setBrush(QBrush(color));

            // If the first visible block is "clipped" such that the previous
            // block is part of the text block area, then only draw a rectangle
            // with the bottom corners rounded, and with the top corners square
            // to reflect that the first visible block is part of a larger block
            // of text.
            //
            if (clipTop) {
                QPainterPath path;
                path.setFillRule(Qt::WindingFill);
                path.addRoundedRect(blockAreaRect, cornerRadius, cornerRadius);
                qreal adjustedHeight = blockAreaRect.height() / 2;
                path.addRect(blockAreaRect.adjusted(0, 0, 0, -adjustedHeight));
                painter.drawPath(path.simplified());
                clipTop = false;
            }
            // Else draw the entire rectangle with all corners rounded.
            else {
                painter.drawRoundedRect(blockAreaRect, cornerRadius,
                                        cornerRadius);
            }

            drawBlock = false;
        }

        // this fixes the RTL bug of QPlainTextEdit
        // https://bugreports.qt.io/browse/QTBUG-7516
        if (block.text().isRightToLeft()) {
            QTextLayout *layout = block.layout();
            // opt = document()->defaultTextOption();
            QTextOption opt = QTextOption(Qt::AlignRight);
            opt.setTextDirection(Qt::RightToLeft);
            layout->setTextOption(opt);
        }

        // Current line highlight
        QTextCursor cursor = textCursor();
        if (highlightCurrentLine() && cursor.block() == block) {
            QTextLine line = block.layout()->lineForTextPosition(cursor.positionInBlock());
            QRectF lineRect = line.rect();
            lineRect.moveTop(lineRect.top() + r.top());
            lineRect.setLeft(0.);
            lineRect.setRight(viewportRect.width());
            painter.fillRect(lineRect.toAlignedRect(), currentLineHighlightColor());
        }

        block = block.next();
        firstVisible = false;
    }

    painter.end();
    QPlainTextEdit::paintEvent(e);
}